

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::ObjectIntersectorK<4,_true>_>,_false>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar1;
  undefined4 uVar2;
  uint uVar3;
  size_t sVar4;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar5;
  undefined1 auVar6 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  AABBNodeMB4D *node1;
  ulong uVar11;
  RTCIntersectFunctionN p_Var12;
  long lVar13;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar14;
  size_t sVar15;
  uint uVar16;
  size_t sVar17;
  NodeRef *pNVar18;
  undefined1 auVar19 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  vint4 ai;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  vint4 ai_1;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  vint4 ai_3;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  vint4 ai_2;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  vint4 bi;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  vint4 bi_1;
  undefined1 auVar41 [16];
  vint4 bi_3;
  undefined1 auVar42 [16];
  undefined1 in_ZMM9 [64];
  vint4 bi_2;
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 local_1818 [16];
  RTCIntersectFunctionNArguments local_17d0;
  Geometry *local_17a0;
  undefined8 local_1798;
  RTCIntersectArguments *local_1790;
  undefined1 local_1788 [16];
  undefined1 local_1778 [16];
  undefined1 local_1768 [16];
  undefined1 local_1758 [16];
  undefined8 local_1748;
  undefined8 uStack_1740;
  undefined1 local_1738 [16];
  float local_1728;
  float fStack_1724;
  float fStack_1720;
  float fStack_171c;
  float local_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float local_1708;
  float fStack_1704;
  float fStack_1700;
  float fStack_16fc;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_16f8;
  vint<4> mask;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  stack_node[1].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack_node[1].ptr != 8) {
    auVar22 = vpcmpeqd_avx(in_ZMM9._0_16_,in_ZMM9._0_16_);
    auVar6 = vpcmpeqd_avx(auVar22,(undefined1  [16])valid_i->field_0);
    auVar28 = ZEXT816(0) << 0x40;
    auVar43 = ZEXT1664(auVar28);
    auVar23 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar28,5);
    auVar19 = auVar6 & auVar23;
    if ((((auVar19 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar19 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar19 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar19[0xf] < '\0')
    {
      local_1788 = vandps_avx(auVar23,auVar6);
      auVar27._8_4_ = 0x7fffffff;
      auVar27._0_8_ = 0x7fffffff7fffffff;
      auVar27._12_4_ = 0x7fffffff;
      auVar23 = vandps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar27);
      auVar39._8_4_ = 0x219392ef;
      auVar39._0_8_ = 0x219392ef219392ef;
      auVar39._12_4_ = 0x219392ef;
      auVar23 = vcmpps_avx(auVar23,auVar39,1);
      auVar6 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar39,auVar23);
      auVar23 = vandps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar27);
      auVar23 = vcmpps_avx(auVar23,auVar39,1);
      auVar19 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar39,auVar23);
      auVar23 = vandps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar27);
      auVar23 = vcmpps_avx(auVar23,auVar39,1);
      auVar23 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar39,auVar23);
      auVar27 = vrcpps_avx(auVar6);
      auVar24._8_4_ = 0x3f800000;
      auVar24._0_8_ = 0x3f8000003f800000;
      auVar24._12_4_ = 0x3f800000;
      auVar21 = vfnmadd213ps_fma(auVar6,auVar27,auVar24);
      auVar39 = vrcpps_avx(auVar19);
      auVar25 = vfnmadd213ps_fma(auVar19,auVar39,auVar24);
      auVar19 = vrcpps_avx(auVar23);
      auVar6 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar28);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      local_16f8.v = (__m128)vblendvps_avx(stack_near[0].field_0,auVar6,local_1788);
      auVar24 = vfnmadd213ps_fma(auVar23,auVar19,auVar24);
      local_1818._4_4_ = local_1788._4_4_ ^ auVar22._4_4_;
      local_1818._0_4_ = local_1788._0_4_ ^ auVar22._0_4_;
      local_1818._8_4_ = local_1788._8_4_ ^ auVar22._8_4_;
      local_1818._12_4_ = local_1788._12_4_ ^ auVar22._12_4_;
      auVar23 = *(undefined1 (*) [16])ray;
      auVar22 = *(undefined1 (*) [16])(ray + 0x10);
      local_1768 = vfmadd132ps_fma(auVar25,auVar39,auVar39);
      auVar45 = ZEXT1664(local_1768);
      auVar6 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar28);
      auVar28._8_4_ = 0xff800000;
      auVar28._0_8_ = 0xff800000ff800000;
      auVar28._12_4_ = 0xff800000;
      auVar6 = vblendvps_avx(auVar28,auVar6,local_1788);
      local_1758 = vfmadd132ps_fma(auVar21,auVar27,auVar27);
      auVar44 = ZEXT1664(local_1758);
      local_1778 = vfmadd132ps_fma(auVar24,auVar19,auVar19);
      auVar46 = ZEXT1664(local_1778);
      pNVar18 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar14 = &stack_near[2].field_0;
      stack_near[1].field_0 = local_16f8;
      local_1708 = local_1758._0_4_ * -auVar23._0_4_;
      fStack_1704 = local_1758._4_4_ * -auVar23._4_4_;
      fStack_1700 = local_1758._8_4_ * -auVar23._8_4_;
      fStack_16fc = local_1758._12_4_ * -auVar23._12_4_;
      local_1718 = local_1768._0_4_ * -auVar22._0_4_;
      fStack_1714 = local_1768._4_4_ * -auVar22._4_4_;
      fStack_1710 = local_1768._8_4_ * -auVar22._8_4_;
      fStack_170c = local_1768._12_4_ * -auVar22._12_4_;
      local_1728 = local_1778._0_4_ * -*(float *)(ray + 0x20);
      fStack_1724 = local_1778._4_4_ * -*(float *)(ray + 0x24);
      fStack_1720 = local_1778._8_4_ * -*(float *)(ray + 0x28);
      fStack_171c = local_1778._12_4_ * -*(float *)(ray + 0x2c);
      local_1748 = mm_lookupmask_ps._0_8_;
      uStack_1740 = mm_lookupmask_ps._8_8_;
LAB_0155c453:
      sVar17 = pNVar18[-1].ptr;
      if (sVar17 != 0xfffffffffffffff8) {
        pNVar18 = pNVar18 + -1;
        paVar1 = paVar14 + -1;
        paVar14 = paVar14 + -1;
        aVar20.v = (__m128)vcmpps_avx(*paVar1,auVar6,1);
        aVar7 = *paVar1;
        if (((((undefined1  [16])aVar20 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             ((undefined1  [16])aVar20 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            ((undefined1  [16])aVar20 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            aVar20.i[3]._3_1_ < '\0') {
          do {
            uVar16 = (uint)sVar17;
            if ((sVar17 & 8) != 0) {
              if (sVar17 == 0xfffffffffffffff8) goto LAB_0155c805;
              auVar23 = vcmpps_avx(auVar6,(undefined1  [16])aVar7,6);
              if ((((auVar23 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar23 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar23 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar23[0xf] < '\0') {
                auVar23 = vpcmpeqd_avx(auVar23,auVar23);
                lVar13 = 0;
                local_1738 = auVar23 ^ local_1818;
                goto LAB_0155c69d;
              }
              break;
            }
            uVar11 = sVar17 & 0xfffffffffffffff0;
            aVar20.i[2] = 0x7f800000;
            aVar20._0_8_ = 0x7f8000007f800000;
            aVar20.i[3] = 0x7f800000;
            sVar17 = 8;
            for (lVar13 = -0x10;
                (lVar13 != 0 && (sVar4 = *(size_t *)(uVar11 + 0x20 + lVar13 * 2), sVar4 != 8));
                lVar13 = lVar13 + 4) {
              uVar2 = *(undefined4 *)(uVar11 + 0x90 + lVar13);
              auVar29._4_4_ = uVar2;
              auVar29._0_4_ = uVar2;
              auVar29._8_4_ = uVar2;
              auVar29._12_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar11 + 0x30 + lVar13);
              auVar25._4_4_ = uVar2;
              auVar25._0_4_ = uVar2;
              auVar25._8_4_ = uVar2;
              auVar25._12_4_ = uVar2;
              auVar23 = *(undefined1 (*) [16])(ray + 0x70);
              auVar22 = vfmadd231ps_fma(auVar25,auVar23,auVar29);
              uVar2 = *(undefined4 *)(uVar11 + 0xb0 + lVar13);
              auVar32._4_4_ = uVar2;
              auVar32._0_4_ = uVar2;
              auVar32._8_4_ = uVar2;
              auVar32._12_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar11 + 0x50 + lVar13);
              auVar30._4_4_ = uVar2;
              auVar30._0_4_ = uVar2;
              auVar30._8_4_ = uVar2;
              auVar30._12_4_ = uVar2;
              auVar19 = vfmadd231ps_fma(auVar30,auVar23,auVar32);
              uVar2 = *(undefined4 *)(uVar11 + 0xd0 + lVar13);
              auVar35._4_4_ = uVar2;
              auVar35._0_4_ = uVar2;
              auVar35._8_4_ = uVar2;
              auVar35._12_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar11 + 0x70 + lVar13);
              auVar33._4_4_ = uVar2;
              auVar33._0_4_ = uVar2;
              auVar33._8_4_ = uVar2;
              auVar33._12_4_ = uVar2;
              auVar39 = vfmadd231ps_fma(auVar33,auVar23,auVar35);
              uVar2 = *(undefined4 *)(uVar11 + 0xa0 + lVar13);
              auVar36._4_4_ = uVar2;
              auVar36._0_4_ = uVar2;
              auVar36._8_4_ = uVar2;
              auVar36._12_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar11 + 0x40 + lVar13);
              auVar40._4_4_ = uVar2;
              auVar40._0_4_ = uVar2;
              auVar40._8_4_ = uVar2;
              auVar40._12_4_ = uVar2;
              auVar21 = vfmadd231ps_fma(auVar40,auVar23,auVar36);
              uVar2 = *(undefined4 *)(uVar11 + 0xc0 + lVar13);
              auVar37._4_4_ = uVar2;
              auVar37._0_4_ = uVar2;
              auVar37._8_4_ = uVar2;
              auVar37._12_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar11 + 0x60 + lVar13);
              auVar41._4_4_ = uVar2;
              auVar41._0_4_ = uVar2;
              auVar41._8_4_ = uVar2;
              auVar41._12_4_ = uVar2;
              auVar25 = vfmadd231ps_fma(auVar41,auVar23,auVar37);
              uVar2 = *(undefined4 *)(uVar11 + 0xe0 + lVar13);
              auVar38._4_4_ = uVar2;
              auVar38._0_4_ = uVar2;
              auVar38._8_4_ = uVar2;
              auVar38._12_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar11 + 0x80 + lVar13);
              auVar42._4_4_ = uVar2;
              auVar42._0_4_ = uVar2;
              auVar42._8_4_ = uVar2;
              auVar42._12_4_ = uVar2;
              auVar24 = vfmadd231ps_fma(auVar42,auVar23,auVar38);
              auVar10._4_4_ = fStack_1704;
              auVar10._0_4_ = local_1708;
              auVar10._8_4_ = fStack_1700;
              auVar10._12_4_ = fStack_16fc;
              auVar28 = vfmadd213ps_fma(auVar22,auVar44._0_16_,auVar10);
              auVar9._4_4_ = fStack_1714;
              auVar9._0_4_ = local_1718;
              auVar9._8_4_ = fStack_1710;
              auVar9._12_4_ = fStack_170c;
              auVar27 = vfmadd213ps_fma(auVar19,auVar45._0_16_,auVar9);
              auVar8._4_4_ = fStack_1724;
              auVar8._0_4_ = local_1728;
              auVar8._8_4_ = fStack_1720;
              auVar8._12_4_ = fStack_171c;
              auVar39 = vfmadd213ps_fma(auVar39,auVar46._0_16_,auVar8);
              auVar21 = vfmadd213ps_fma(auVar21,auVar44._0_16_,auVar10);
              auVar25 = vfmadd213ps_fma(auVar25,auVar45._0_16_,auVar9);
              auVar24 = vfmadd213ps_fma(auVar24,auVar46._0_16_,auVar8);
              auVar22 = vpminsd_avx(auVar28,auVar21);
              auVar19 = vpminsd_avx(auVar27,auVar25);
              auVar22 = vpmaxsd_avx(auVar22,auVar19);
              auVar19 = vpminsd_avx(auVar39,auVar24);
              auVar22 = vpmaxsd_avx(auVar22,auVar19);
              auVar19 = vpmaxsd_avx(auVar28,auVar21);
              auVar28 = vpmaxsd_avx(auVar27,auVar25);
              auVar28 = vpminsd_avx(auVar19,auVar28);
              auVar19 = vpmaxsd_avx(auVar39,auVar24);
              auVar19 = vpminsd_avx(auVar19,auVar6);
              auVar28 = vpminsd_avx(auVar28,auVar19);
              auVar19 = vpmaxsd_avx(auVar22,(undefined1  [16])local_16f8);
              if ((uVar16 & 7) == 6) {
                auVar19 = vcmpps_avx(auVar19,auVar28,2);
                uVar2 = *(undefined4 *)(uVar11 + 0xf0 + lVar13);
                auVar31._4_4_ = uVar2;
                auVar31._0_4_ = uVar2;
                auVar31._8_4_ = uVar2;
                auVar31._12_4_ = uVar2;
                auVar28 = vcmpps_avx(auVar31,auVar23,2);
                uVar2 = *(undefined4 *)(uVar11 + 0x100 + lVar13);
                auVar34._4_4_ = uVar2;
                auVar34._0_4_ = uVar2;
                auVar34._8_4_ = uVar2;
                auVar34._12_4_ = uVar2;
                auVar23 = vcmpps_avx(auVar23,auVar34,1);
                auVar23 = vandps_avx(auVar28,auVar23);
                auVar23 = vandps_avx(auVar23,auVar19);
              }
              else {
                auVar23 = vcmpps_avx(auVar19,auVar28,2);
              }
              auVar19 = vcmpps_avx(auVar6,(undefined1  [16])aVar7,6);
              auVar23 = vandps_avx(auVar23,auVar19);
              auVar23 = vpslld_avx(auVar23,0x1f);
              sVar15 = sVar17;
              aVar5 = aVar20;
              if (((((auVar23 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                    (auVar23 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar23 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   auVar23[0xf] < '\0') &&
                 (auVar26._8_4_ = 0x7f800000, auVar26._0_8_ = 0x7f8000007f800000,
                 auVar26._12_4_ = 0x7f800000,
                 aVar5 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vblendvps_avx(auVar26,auVar22,auVar23), sVar15 = sVar4, sVar17 != 8)) {
                pNVar18->ptr = sVar17;
                pNVar18 = pNVar18 + 1;
                *paVar14 = aVar20;
                paVar14 = paVar14 + 1;
              }
              aVar20 = aVar5;
              sVar17 = sVar15;
            }
            aVar7 = aVar20;
          } while (sVar17 != 8);
        }
        goto LAB_0155c453;
      }
LAB_0155c805:
      auVar23 = vandps_avx(local_1818,local_1788);
      auVar22._8_4_ = 0xff800000;
      auVar22._0_8_ = 0xff800000ff800000;
      auVar22._12_4_ = 0xff800000;
      auVar23 = vmaskmovps_avx(auVar23,auVar22);
      *(undefined1 (*) [16])(ray + 0x80) = auVar23;
    }
  }
  return;
  while( true ) {
    local_17d0.geomID = *(uint *)((sVar17 & 0xfffffffffffffff0) + lVar13 * 8);
    local_17a0 = (context->scene->geometries).items[local_17d0.geomID].ptr;
    uVar3 = local_17a0->mask;
    auVar23._4_4_ = uVar3;
    auVar23._0_4_ = uVar3;
    auVar23._8_4_ = uVar3;
    auVar23._12_4_ = uVar3;
    auVar23 = vpand_avx(auVar23,*(undefined1 (*) [16])(ray + 0x90));
    auVar23 = vpcmpeqd_avx(auVar43._0_16_,auVar23);
    auVar22 = local_1738 & ~auVar23;
    aVar20._8_8_ = uStack_1740;
    aVar20._0_8_ = local_1748;
    if ((((auVar22 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar22 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar22 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar22[0xf] < '\0')
    {
      mask.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)vandnps_avx(auVar23,local_1738);
      local_17d0.primID = *(uint *)((sVar17 & 0xfffffffffffffff0) + 4 + lVar13 * 8);
      local_17d0.valid = (int *)&mask;
      local_17d0.geometryUserPtr = local_17a0->userPtr;
      local_17d0.context = context->user;
      local_17d0.N = 4;
      local_1798 = 0;
      local_1790 = context->args;
      p_Var12 = local_1790->intersect;
      if (p_Var12 == (RTCIntersectFunctionN)0x0) {
        p_Var12 = (RTCIntersectFunctionN)
                  local_17a0[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      }
      local_17d0.rayhit = (RTCRayHitN *)ray;
      (*p_Var12)(&local_17d0);
      auVar43 = ZEXT1664(ZEXT816(0) << 0x40);
      aVar20 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
               vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),ZEXT816(0) << 0x40,1);
      auVar44 = ZEXT1664(local_1758);
      auVar45 = ZEXT1664(local_1768);
      auVar46 = ZEXT1664(local_1778);
    }
    auVar23 = vandnps_avx((undefined1  [16])aVar20,local_1738);
    lVar13 = lVar13 + 1;
    auVar22 = local_1738 & ~(undefined1  [16])aVar20;
    local_1738 = auVar23;
    if ((((auVar22 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar22 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar22 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar22[0xf])
    break;
LAB_0155c69d:
    auVar23 = local_1738;
    if ((ulong)(uVar16 & 0xf) - 8 == lVar13) break;
  }
  auVar22 = vpcmpeqd_avx((undefined1  [16])aVar20,(undefined1  [16])aVar20);
  auVar19._0_4_ = auVar23._0_4_ ^ auVar22._0_4_;
  auVar19._4_4_ = auVar23._4_4_ ^ auVar22._4_4_;
  auVar19._8_4_ = auVar23._8_4_ ^ auVar22._8_4_;
  auVar19._12_4_ = auVar23._12_4_ ^ auVar22._12_4_;
  local_1818 = vorps_avx(local_1818,auVar19);
  auVar23 = vpcmpeqd_avx(auVar19,auVar19);
  auVar23 = auVar23 & ~local_1818;
  if ((((auVar23 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar23 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar23 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar23[0xf])
  goto LAB_0155c805;
  auVar21._8_4_ = 0xff800000;
  auVar21._0_8_ = 0xff800000ff800000;
  auVar21._12_4_ = 0xff800000;
  auVar6 = vblendvps_avx(auVar6,auVar21,local_1818);
  goto LAB_0155c453;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }